

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall
UniQueue<FileTarget>::
emplace_back<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
          (UniQueue<FileTarget> *this,path *s,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1,PackFormat *s_2,
          long *s_3)

{
  set<FileTarget,_std::less<FileTarget>,_std::allocator<FileTarget>_> *this_00;
  pair<std::_Rb_tree_iterator<FileTarget>,_bool> pVar1;
  undefined1 auStack_f0 [8];
  _Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
  it;
  _Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
  local_b0;
  const_iterator local_90;
  iterator local_70;
  path *local_50;
  long *local_48;
  PackFormat *local_40;
  value_type local_38;
  KEY key;
  
  if (this->dirty == true) {
    cleanup(this,(EVP_PKEY_CTX *)s);
  }
  this_00 = &this->unique;
  local_50 = s;
  pVar1 = std::
          _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
          ::
          _M_emplace_unique<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
                    ((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                      *)this_00,s,s_1,s_2,s_3);
  local_38._M_data = (FileTarget *)((_Base_ptr)pVar1.first._M_node + 1);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    it._M_node = (_Map_pointer)
                 (this->
                 super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                 ).
                 super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_b0._M_cur =
         (this->
         super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ).
         super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_b0._M_first =
         (this->
         super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ).
         super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_b0._M_last =
         (this->
         super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ).
         super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_b0._M_node =
         (this->
         super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ).
         super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_48 = s_3;
    local_40 = s_2;
    std::
    find_if<std::_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>&,std::reference_wrapper<FileTarget_const>*>,UniQueue<FileTarget>::emplace_back<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>(std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&)::_lambda(std::reference_wrapper<FileTarget_const>const&)_1_>
              ((_Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
                *)auStack_f0,
               (_Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
                *)&it._M_node,&local_b0,&local_38);
    local_90._M_cur = (_Elt_pointer)auStack_f0;
    local_90._M_first = it._M_cur;
    local_90._M_last = it._M_first;
    local_90._M_node = (_Map_pointer)it._M_last;
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::erase(&local_70,
            &this->
             super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
            ,&local_90);
    std::
    _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
    ::erase_abi_cxx11_((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                        *)this_00,(_Base_ptr)pVar1.first._M_node);
    pVar1 = std::
            _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
            ::
            _M_emplace_unique<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,PackFormat&,long_const&>
                      ((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                        *)this_00,local_50,s_1,local_40,local_48);
    local_38._M_data = (FileTarget *)(pVar1.first._M_node._M_node + 1);
  }
  std::
  deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
  ::push_back(&this->
               super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
              ,&local_38);
  return;
}

Assistant:

void emplace_back(S&&... s)
    {
        if (dirty)
            cleanup();
        auto r = unique.emplace(std::forward<S>(s)...);
        KEY key = std::cref(*r.first);
        if (!r.second) { // If already present we must remove the prevous one in
                         // the deck
            auto it = std::find_if(
                PARENT::begin(), PARENT::end(),
                [&](const KEY& k) -> bool { return key.get() == k.get(); });
            PARENT::erase(it);
            unique.erase(r.first);
            r = unique.emplace(std::forward<S>(s)...);
            key = std::cref(*r.first);
        }
        PARENT::push_back(key);
    }